

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conductor.hpp
# Opt level: O2

Color __thiscall
ConductorBRDF::sample_f
          (ConductorBRDF *this,Color *albedo,vec3f *wo,vec3f *wi,float *pdf,Sampler *sampler)

{
  undefined1 *a;
  ulong uVar1;
  Color *a_00;
  float fVar2;
  float fVar3;
  float extraout_XMM0_Dc;
  float extraout_XMM0_Dc_00;
  float extraout_XMM0_Dc_01;
  float extraout_XMM0_Dc_02;
  float extraout_XMM0_Dc_03;
  float extraout_XMM0_Dc_04;
  float extraout_XMM0_Dc_05;
  float extraout_XMM0_Dc_06;
  float extraout_XMM0_Dd;
  float extraout_XMM0_Dd_00;
  float extraout_XMM0_Dd_01;
  float extraout_XMM0_Dd_02;
  float extraout_XMM0_Dd_03;
  float extraout_XMM0_Dd_04;
  float extraout_XMM0_Dd_05;
  float extraout_XMM0_Dd_06;
  float fVar4;
  float fVar5;
  undefined4 uVar10;
  undefined1 auVar6 [16];
  undefined1 auVar9 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  float fVar13;
  float fVar16;
  float fVar17;
  float fVar18;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  vec3f vVar19;
  vec3f vVar20;
  vec3f vVar21;
  vec3f vVar22;
  vec3f vVar23;
  vec3f vVar24;
  vec3f vVar25;
  vec3f vVar26;
  Color CVar27;
  float local_a8;
  float fStack_a4;
  float local_88;
  float fStack_84;
  float local_78;
  float fStack_74;
  float local_68;
  float fStack_64;
  float local_58;
  float fStack_54;
  float local_48;
  float fStack_44;
  float local_38;
  float fStack_34;
  vec3f local_28;
  float fVar28;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  uVar1._0_4_ = wo->x;
  uVar1._4_4_ = wo->y;
  fVar3 = wo->z;
  wi->x = (float)(int)(uVar1 ^ 0x8000000080000000);
  wi->y = (float)(int)((uVar1 ^ 0x8000000080000000) >> 0x20);
  wi->z = fVar3;
  fVar3 = wo->z;
  uVar10 = 0;
  fVar2 = ABS(fVar3);
  *pdf = 1.0;
  a = &(this->super_BRDF).field_0x10;
  vVar19 = operator*((vec3f *)a,(vec3f *)a);
  a_00 = &this->k;
  vVar20 = operator*(a_00,a_00);
  fVar3 = fVar3 * fVar3;
  fVar4 = (vVar20.z + vVar19.z) * fVar3;
  vVar21 = operator*(2.0,(vec3f *)a);
  vVar22 = operator*(2.0,(vec3f *)a);
  vVar23 = operator*((vec3f *)a,(vec3f *)a);
  vVar24 = operator*(a_00,a_00);
  fVar5 = vVar24.z + vVar23.z;
  vVar25 = operator*(2.0,(vec3f *)a);
  vVar26 = operator*(2.0,(vec3f *)a);
  auVar7._0_8_ = (undefined8)DAT_00147110;
  auVar7._12_4_ = DAT_00147110._12_4_;
  auVar7._8_4_ = DAT_00147110._4_4_;
  auVar6._8_8_ = auVar7._8_8_;
  auVar6._0_4_ = (undefined4)DAT_00147110;
  auVar6._4_4_ = (fVar4 - vVar21.z * fVar2) + 1.0;
  auVar8._0_12_ = auVar6._0_12_;
  auVar8._12_4_ = 0;
  auVar9._4_4_ = vVar22.z * fVar2 + fVar4 + 1.0;
  auVar9._0_4_ = fVar2;
  auVar9._8_4_ = 0;
  auVar9._12_4_ = uVar10;
  auVar9 = divps(auVar8,auVar9);
  fVar4 = auVar9._0_4_;
  local_48 = vVar20.x;
  fStack_44 = vVar20.y;
  local_38 = vVar19.x;
  fStack_34 = vVar19.y;
  fVar13 = (local_48 + local_38) * fVar3;
  fVar16 = (fStack_44 + fStack_34) * fVar3;
  fVar17 = (extraout_XMM0_Dc_00 + extraout_XMM0_Dc) * fVar3;
  fVar18 = (extraout_XMM0_Dd_00 + extraout_XMM0_Dd) * fVar3;
  local_58 = vVar21.x;
  fStack_54 = vVar21.y;
  auVar11._0_4_ = (fVar13 - local_58 * fVar2) + 1.0;
  auVar11._4_4_ = (fVar16 - fStack_54 * fVar2) + 1.0;
  auVar11._8_4_ = (fVar17 - extraout_XMM0_Dc_01 * fVar2) + 0.0;
  auVar11._12_4_ = (fVar18 - extraout_XMM0_Dd_01 * fVar2) + 0.0;
  local_68 = vVar22.x;
  fStack_64 = vVar22.y;
  auVar12._4_4_ = fStack_64 * fVar2 + fVar16 + 1.0;
  auVar12._0_4_ = local_68 * fVar2 + fVar13 + 1.0;
  auVar12._8_4_ = extraout_XMM0_Dc_02 * fVar2 + fVar17 + 0.0;
  auVar12._12_4_ = extraout_XMM0_Dd_02 * fVar2 + fVar18 + 0.0;
  auVar12 = divps(auVar11,auVar12);
  local_88 = vVar24.x;
  fStack_84 = vVar24.y;
  local_78 = vVar23.x;
  fStack_74 = vVar23.y;
  local_a8 = vVar25.x;
  fStack_a4 = vVar25.y;
  auVar14._0_4_ = ((local_88 + local_78) - local_a8 * fVar2) + fVar3;
  auVar14._4_4_ = ((fStack_84 + fStack_74) - fStack_a4 * fVar2) + fVar3;
  auVar14._8_4_ =
       ((extraout_XMM0_Dc_04 + extraout_XMM0_Dc_03) - extraout_XMM0_Dc_05 * fVar2) + fVar3;
  auVar14._12_4_ =
       ((extraout_XMM0_Dd_04 + extraout_XMM0_Dd_03) - extraout_XMM0_Dd_05 * fVar2) + fVar3;
  auVar15._4_4_ = vVar26.y * fVar2 + fStack_84 + fStack_74 + fVar3;
  auVar15._0_4_ = vVar26.x * fVar2 + local_88 + local_78 + fVar3;
  auVar15._8_4_ = extraout_XMM0_Dc_06 * fVar2 + extraout_XMM0_Dc_04 + extraout_XMM0_Dc_03 + fVar3;
  auVar15._12_4_ = extraout_XMM0_Dd_06 * fVar2 + extraout_XMM0_Dd_04 + extraout_XMM0_Dd_03 + fVar3;
  auVar15 = divps(auVar14,auVar15);
  local_28.z = (auVar9._4_4_ +
               ((fVar5 - vVar25.z * fVar2) + fVar3) / (vVar26.z * fVar2 + fVar5 + fVar3)) * fVar4;
  local_28.x = fVar4 * (auVar15._0_4_ + auVar12._0_4_);
  local_28.y = fVar4 * (auVar15._4_4_ + auVar12._4_4_);
  vVar19 = operator*(&local_28,albedo);
  CVar27.x = vVar19.x;
  CVar27.y = vVar19.y;
  register0x00001240 = vVar19.z;
  return CVar27;
}

Assistant:

Color sample_f(const Color& albedo, const vec3f& wo, vec3f& wi, float& pdf, Sampler& sampler) const override
	{
		wi = vec3f(-wo.x, -wo.y, wo.z);
		float cos = fabs(wo.z);
		pdf = 1;
		Color t1 = (eta*eta + k*k) * (cos*cos);
		Color r1 = (t1 - 2*eta*cos + 1) / (t1 + 2*eta*cos + 1);
		Color t2 = eta*eta + k*k;
		Color r2 = (t2 - 2*eta*cos + Color(cos*cos)) / (t2 + 2*eta*cos + Color(cos*cos));
		return 0.5 / cos * (r1 + r2) * albedo;
	}